

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  MessageLite *pMVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  string *psVar12;
  uint *puVar13;
  Arena *arena;
  long *plVar14;
  ushort *puVar15;
  pair<const_char_*,_int> pVar16;
  int local_40;
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail(puVar13);
    }
    *puVar13 = *puVar13 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar14 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar14 & 7) != 0) {
    AlignFail(plVar14);
  }
  lVar2 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar14 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar8 = ClassData::New(*(ClassData **)(lVar2 + 0x20),arena);
    *plVar14 = (long)pMVar8;
  }
  if (ptr[2] < '\0') {
    pVar16 = ReadSizeFallback(ptr + 2,(uint)(byte)ptr[2]);
    puVar15 = (ushort *)pVar16.first;
    if (puVar15 == (ushort *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    puVar15 = (ushort *)(ptr + 3);
  }
  if (0 < ctx->depth_) {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)puVar15);
    iVar4 = local_40;
    lVar9 = (long)ctx->depth_ + -1;
    iVar6 = (int)lVar9;
    ctx->depth_ = iVar6;
    lVar3 = *plVar14;
    _local_40 = puVar15;
    while (bVar5 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffc0,
                              ctx->group_depth_), !bVar5) {
      uVar7 = (uint)*(byte *)(lVar2 + 8) & (uint)*_local_40;
      if ((uVar7 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar10 = (ulong)(uVar7 & 0xfffffff8);
      _local_40 = (ushort *)
                  (**(code **)(lVar2 + 0x38 + uVar10 * 2))
                            (lVar3,_local_40,ctx,
                             (ulong)*_local_40 ^ *(ulong *)(lVar2 + 0x40 + uVar10 * 2),lVar2,0);
      if ((_local_40 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    puVar15 = _local_40;
    if ((*(byte *)(lVar2 + 9) & 1) != 0) {
      puVar15 = (ushort *)(**(code **)(lVar2 + 0x28))(lVar3,_local_40,ctx);
    }
    iVar1 = ctx->depth_;
    if ((puVar15 != (ushort *)0x0) && (iVar6 != iVar1)) {
      psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (lVar9,(long)iVar1,"old_depth == depth_");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,1099,*(undefined8 *)(psVar12 + 8),*(undefined8 *)psVar12);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0);
    }
    ctx->depth_ = iVar1 + 1;
    uVar7 = iVar4 + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar7;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar7 >> 0x1f & uVar7);
      return (char *)puVar15;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}